

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  char *local_80;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  char *local_30;
  char *local_20;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "------------ Running tests for Player class ------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_Constructor();
  if (bVar1) {
    local_20 = "\x1b[32mPass";
  }
  else {
    local_20 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getOwnedCountries");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getOwnedCountries(true);
  if (bVar1) {
    local_30 = "\x1b[32mPass";
  }
  else {
    local_30 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getCards");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getHand(true);
  if (bVar1) {
    local_40 = "\x1b[32mPass";
  }
  else {
    local_40 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getDiceRoller");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getDiceRoller(true);
  if (bVar1) {
    local_50 = "\x1b[32mPass";
  }
  else {
    local_50 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_50);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"attack");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_attack();
  if (bVar1) {
    local_60 = "\x1b[32mPass";
  }
  else {
    local_60 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_60);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"reinforce");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_reinforce(true);
  if (bVar1) {
    local_70 = "\x1b[32mPass";
  }
  else {
    local_70 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_70);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"fortify");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_fortify(true);
  if (bVar1) {
    local_80 = "\x1b[32mPass";
  }
  else {
    local_80 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_80);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running tests for Player class ------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m" << std::endl;

    std::cout << assert("Player", "constructor", test_Player_Constructor()) << std::endl;

    std::cout << assert("Player", "getOwnedCountries", test_Player_getOwnedCountries(true)) << std::endl;

    std::cout << assert("Player", "getCards", test_Player_getHand(true)) << std::endl;

    std::cout << assert("Player", "getDiceRoller", test_Player_getDiceRoller(true)) << std::endl;

    std::cout << assert("Player", "attack", test_Player_attack()) << std::endl;

    std::cout << assert("Player", "reinforce", test_Player_reinforce(true)) << std::endl;

    std::cout << assert("Player", "fortify", test_Player_fortify(true)) << std::endl;

}